

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool pugi::impl::anon_unknown_0::convert_string_to_number_scratch
               (char_t (*buffer) [32],char_t *begin,char_t *end,double *out_result)

{
  ulong __n;
  double dVar1;
  char_t (*local_40) [32];
  char_t *scratch;
  size_t length;
  double *out_result_local;
  char_t *end_local;
  char_t *begin_local;
  char_t (*buffer_local) [32];
  
  __n = (long)end - (long)begin;
  local_40 = buffer;
  if ((__n < 0x20) ||
     (local_40 = (char_t (*) [32])
                 (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                           allocate)(__n + 1), local_40 != (char_t (*) [32])0x0)) {
    memcpy(local_40,begin,__n);
    *(undefined1 *)((long)local_40 + __n) = 0;
    dVar1 = convert_string_to_number(*local_40);
    *out_result = dVar1;
    if (local_40 != buffer) {
      (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
                (local_40);
    }
    buffer_local._7_1_ = true;
  }
  else {
    buffer_local._7_1_ = false;
  }
  return buffer_local._7_1_;
}

Assistant:

PUGI__FN bool convert_string_to_number_scratch(char_t (&buffer)[32], const char_t* begin, const char_t* end, double* out_result)
	{
		size_t length = static_cast<size_t>(end - begin);
		char_t* scratch = buffer;

		if (length >= sizeof(buffer) / sizeof(buffer[0]))
		{
			// need to make dummy on-heap copy
			scratch = static_cast<char_t*>(xml_memory::allocate((length + 1) * sizeof(char_t)));
			if (!scratch) return false;
		}

		// copy string to zero-terminated buffer and perform conversion
		memcpy(scratch, begin, length * sizeof(char_t));
		scratch[length] = 0;

		*out_result = convert_string_to_number(scratch);

		// free dummy buffer
		if (scratch != buffer) xml_memory::deallocate(scratch);

		return true;
	}